

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::LinearQuantizationParams::ByteSizeLong(LinearQuantizationParams *this)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int cached_size;
  int cached_size_2;
  size_t data_size_1;
  uint count_1;
  int cached_size_1;
  size_t data_size;
  long lStack_18;
  uint count;
  size_t total_size;
  LinearQuantizationParams *this_local;
  
  lStack_18 = 0;
  uVar1 = scale_size(this);
  sVar3 = (ulong)uVar1 * 4;
  if ((ulong)uVar1 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    lStack_18 = sVar4 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_scale_cached_byte_size_ = iVar2;
  lStack_18 = sVar3 + lStack_18;
  uVar1 = bias_size(this);
  sVar3 = (ulong)uVar1 * 4;
  if ((ulong)uVar1 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    lStack_18 = sVar4 + 1 + lStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_bias_cached_byte_size_ = iVar2;
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3 + lStack_18);
  this->_cached_size_ = iVar2;
  return sVar3 + lStack_18;
}

Assistant:

size_t LinearQuantizationParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LinearQuantizationParams)
  size_t total_size = 0;

  // repeated float scale = 1;
  {
    unsigned int count = this->scale_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _scale_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated float bias = 2;
  {
    unsigned int count = this->bias_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _bias_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}